

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipleScatter.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  ostream *poVar3;
  reference pvVar4;
  bool bVar5;
  double *local_488;
  double *local_480;
  double *local_478;
  double *local_470;
  double *local_468;
  double *local_460;
  double *local_458;
  double *local_450;
  double *local_448;
  pointer *local_440;
  ostream *local_438;
  ostream *local_430;
  ostream *local_428;
  ostream *local_420;
  ostream *local_418;
  int local_40c;
  RandomGen *local_408;
  double local_400;
  RandomGen *local_3f8;
  ostream *local_3f0;
  ostream *local_3e8;
  ostream *local_3e0;
  ostream *local_3d8;
  ostream *local_3d0;
  ostream *local_3c8;
  int local_3bc;
  RandomGen *local_3b8;
  int local_3ac;
  RandomGen *local_3a8;
  double local_3a0;
  RandomGen *local_398;
  undefined1 *local_390;
  undefined4 local_388;
  int local_384;
  FILE *local_380;
  ostream *local_378;
  undefined1 *local_370;
  undefined4 local_368;
  int local_364;
  double local_360;
  double cor_S2a_1;
  int index_1;
  int jj_1;
  double thisS2b_corFactor_1;
  double thisS1b_corFactor_1;
  double thisS2a_corFactor_1;
  double thisS1a_corFactor_1;
  double thisS2b_1;
  double thisS2a_1;
  double thisS1b_1;
  double thisS1a_1;
  double totalCorFactor_1;
  double totalS2_1;
  double totalS1_1;
  size_type size1_1;
  int nGenerated;
  double cor_S2b;
  double dStack_2d8;
  int index2;
  double cor_S2a;
  int local_2c8;
  int index;
  int jj;
  int ii;
  double thisS2b_corFactor;
  double thisS1b_corFactor;
  double thisS2a_corFactor;
  double thisS1a_corFactor;
  double thisS2b;
  double thisS2a;
  double thisS1b;
  double thisS1a;
  double totalCorFactor;
  double totalS2;
  double totalS1;
  size_type size2;
  size_type size1;
  double local_250;
  double local_248;
  double local_240;
  undefined4 local_234;
  undefined1 local_230 [4];
  int scan2;
  vector<double,_std::allocator<double>_> S2b_corFactor;
  vector<double,_std::allocator<double>_> S1b_corFactor;
  vector<double,_std::allocator<double>_> S2b;
  vector<double,_std::allocator<double>_> S1b;
  double n2;
  double m2;
  double l2;
  double k2;
  double j2;
  double i2;
  double h2;
  double g2;
  double f2;
  double e2;
  double d2;
  double c2;
  double b2;
  double a2;
  FILE *file2;
  double local_150;
  double local_148;
  double local_140;
  undefined4 local_138;
  int scan;
  undefined1 local_128 [8];
  vector<double,_std::allocator<double>_> S2a_corFactor;
  vector<double,_std::allocator<double>_> S1a_corFactor;
  vector<double,_std::allocator<double>_> S2a;
  vector<double,_std::allocator<double>_> S1a;
  int nLines;
  int ch;
  double n;
  double m;
  double l;
  double k;
  double j;
  double i;
  double h;
  double g;
  double f;
  double e;
  double d;
  double c;
  double b;
  double a;
  FILE *file1;
  bool sameFile;
  double dStack_40;
  bool corrected;
  double maxScatters;
  double minScatters;
  double halfLife;
  int local_20;
  int iStack_1c;
  bool randomScatters;
  int nScatters;
  int nEvents;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _nScatters = argv;
  argv_local._0_4_ = argc;
  if (argc < 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "This program aims to take execNEST outputs, and combine energy deposits into Double Scatters. "
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Usage: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,
                             "./multipleScatter <nEvents> <nScatters> <Pulse Type> <File 1> <optional: File 2> "
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "  -- <nEvents> is the number of events to stitch together. ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "  -- <nScatters> is the number of energy deposits to combine; use -1 for a random exponential draw. "
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "  -- <Pulse Type> is either 0 (for uncorrected pulses) or 1 (for corrected pulses); corrected pulses sum S2s and take an S2-weighted average S1c. "
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "  -- <File 1> is execNEST output events used to stitch together multiple scatters."
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "  -- <File 2> is optional, and will be the last scatter in each event, if provided."
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  else {
    iStack_1c = atoi(argv[1]);
    local_20 = atoi(_nScatters[2]);
    halfLife._7_1_ = local_20 < 2;
    minScatters = 1.0;
    maxScatters = 1.5;
    dStack_40 = 50.0;
    file1._7_1_ = 1;
    iVar2 = atoi(_nScatters[3]);
    if (iVar2 == 0) {
      file1._7_1_ = 0;
    }
    if (0 < verbosity) {
      if ((file1._7_1_ & 1) == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"S1 [phd]\tS2 [phd]\tnScatters");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"S1c [phd]\tS2c [phd]\tnScatters");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
    file1._6_1_ = (int)argv_local < 6;
    a = (double)fopen(_nScatters[4],"r");
    bVar5 = false;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_128);
    if (0 < verbosity) {
      while ((local_364 = getc((FILE *)a), local_364 != -1 && ((local_364 != 10 || (!bVar5))))) {
        bVar5 = local_364 == 0x5d;
      }
    }
    while( true ) {
      local_440 = (pointer *)&nLines;
      local_448 = &n;
      local_450 = &m;
      local_458 = &l;
      local_460 = &k;
      local_468 = &j;
      local_470 = &i;
      local_478 = &h;
      local_480 = &g;
      local_488 = &f;
      local_370 = (undefined1 *)&local_488;
      local_368 = __isoc99_fscanf(a,
                                  "%lf\t%lf\t%lf\t%lf,%lf,%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf"
                                  ,&b,&c,&d,&e);
      local_138 = local_368;
      iVar2 = feof((FILE *)a);
      if (iVar2 != 0) break;
      if ((1.0 < ABS((double)_nLines)) && (1.0 < ABS(n))) {
        local_140 = ABS(k);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   &S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_140);
        local_148 = ABS(n);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   &S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_148);
        local_150 = ABS(l / k);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   &S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_150);
        file2 = (FILE *)ABS((double)_nLines / n);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)local_128,(value_type *)&file2);
      }
    }
    fclose((FILE *)a);
    if ((file1._6_1_ & 1) == 0) {
      local_378 = std::operator<<((ostream *)&std::cerr,"Using two files to generate scatters...");
      std::ostream::operator<<(local_378,std::endl<char,std::char_traits<char>>);
      local_380 = fopen(_nScatters[5],"r");
      bVar5 = false;
      a2 = (double)local_380;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_230);
      if (0 < verbosity) {
        while ((local_384 = getc((FILE *)a2), local_384 != -1 && ((local_384 != 10 || (!bVar5))))) {
          bVar5 = local_384 == 0x5d;
        }
      }
      while( true ) {
        local_440 = &S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        local_448 = &n2;
        local_450 = &m2;
        local_458 = &l2;
        local_460 = &k2;
        local_468 = &j2;
        local_470 = &i2;
        local_478 = &h2;
        local_480 = &g2;
        local_488 = &f2;
        local_390 = (undefined1 *)&local_488;
        local_388 = __isoc99_fscanf(a2,
                                    "%lf\t%lf\t%lf\t%lf,%lf,%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf"
                                    ,&b2,&c2,&d2,&e2);
        local_234 = local_388;
        iVar2 = feof((FILE *)a2);
        if (iVar2 != 0) break;
        if ((1.0 < ABS((double)S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage)) && (1.0 < ABS(n2))) {
          local_240 = ABS(k2);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)
                     &S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_240);
          local_248 = ABS(n2);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)
                     &S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_248);
          local_250 = ABS(l2 / k2);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)
                     &S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_250);
          size1 = (size_type)
                  ABS((double)S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage / n2);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)local_230,(value_type *)&size1);
        }
      }
      fclose((FILE *)a2);
      size2 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)
                         &S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      totalS1 = (double)std::vector<double,_std::allocator<double>_>::size
                                  ((vector<double,_std::allocator<double>_> *)
                                   &S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
      for (index = 0; index < iStack_1c; index = index + 1) {
        while (local_20 < 2) {
          local_398 = RandomGen::rndm();
          local_3a0 = RandomGen::rand_exponential(local_398,minScatters,maxScatters,dStack_40);
          local_20 = (int)(local_3a0 + 0.5);
        }
        totalS2 = 0.0;
        thisS1a = 0.0;
        totalCorFactor = 0.0;
        for (local_2c8 = 0; local_2c8 < local_20 + -1; local_2c8 = local_2c8 + 1) {
          local_3a8 = RandomGen::rndm();
          local_3ac = RandomGen::integer_range(local_3a8,0,(int)size2 + -1);
          cor_S2a._4_4_ = local_3ac;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              &S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(long)local_3ac);
          thisS1b = *pvVar4;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              &S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(long)cor_S2a._4_4_
                             );
          thisS2b = *pvVar4;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              &S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(long)cor_S2a._4_4_
                             );
          thisS2a_corFactor = *pvVar4;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_128,
                              (long)cor_S2a._4_4_);
          thisS1b_corFactor = *pvVar4;
          dVar1 = thisS2b;
          if ((file1._7_1_ & 1) != 0) {
            dStack_2d8 = thisS2b * thisS1b_corFactor;
            thisS1a = thisS2a_corFactor * dStack_2d8 + thisS1a;
            dVar1 = dStack_2d8;
          }
          totalS2 = thisS1b + totalS2;
          totalCorFactor = dVar1 + totalCorFactor;
        }
        local_3b8 = RandomGen::rndm();
        local_3bc = RandomGen::integer_range(local_3b8,0,totalS1._0_4_ + -1);
        cor_S2b._4_4_ = local_3bc;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)local_3bc);
        thisS2a = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(long)cor_S2b._4_4_);
        thisS1a_corFactor = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(long)cor_S2b._4_4_);
        thisS2b_corFactor = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_230,(long)cor_S2b._4_4_
                           );
        _jj = *pvVar4;
        if ((file1._7_1_ & 1) == 0) {
          totalS2 = thisS2a + totalS2;
          totalCorFactor = thisS1a_corFactor + totalCorFactor;
        }
        else {
          _nGenerated = thisS1a_corFactor * _jj;
          totalCorFactor = _nGenerated + totalCorFactor;
          thisS1a = thisS2b_corFactor * _nGenerated + thisS1a;
          totalS2 = (thisS1a / totalCorFactor) * (thisS2a + totalS2);
        }
        local_3c8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,totalS2);
        local_3d0 = std::operator<<(local_3c8,"\t");
        local_3d8 = (ostream *)std::ostream::operator<<(local_3d0,totalCorFactor);
        local_3e0 = std::operator<<(local_3d8,"\t");
        local_3e8 = (ostream *)std::ostream::operator<<(local_3e0,local_20);
        std::ostream::operator<<(local_3e8,std::endl<char,std::char_traits<char>>);
        if ((halfLife._7_1_ & 1) != 0) {
          local_20 = -1;
        }
      }
      argv_local._4_4_ = 0;
      size1_1._4_4_ = 1;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_230);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    else {
      local_3f0 = std::operator<<((ostream *)&std::cerr,"Generating multiple scatters from file...")
      ;
      std::ostream::operator<<(local_3f0,std::endl<char,std::char_traits<char>>);
      size1_1._0_4_ = 0;
      totalS1_1 = (double)std::vector<double,_std::allocator<double>_>::size
                                    ((vector<double,_std::allocator<double>_> *)
                                     &S2a.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      while ((int)size1_1 < iStack_1c) {
        while (local_20 < 2) {
          local_3f8 = RandomGen::rndm();
          local_400 = RandomGen::rand_exponential(local_3f8,minScatters,maxScatters,dStack_40);
          local_20 = (int)(local_400 + 0.5);
        }
        totalS2_1 = 0.0;
        thisS1a_1 = 0.0;
        totalCorFactor_1 = 0.0;
        for (cor_S2a_1._4_4_ = 0; cor_S2a_1._4_4_ < local_20; cor_S2a_1._4_4_ = cor_S2a_1._4_4_ + 1)
        {
          local_408 = RandomGen::rndm();
          local_40c = RandomGen::integer_range(local_408,0,totalS1_1._0_4_ + -1);
          cor_S2a_1._0_4_ = local_40c;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              &S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(long)local_40c);
          thisS1b_1 = *pvVar4;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              &S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)cor_S2a_1._0_4_);
          thisS2b_1 = *pvVar4;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              &S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)cor_S2a_1._0_4_);
          thisS2a_corFactor_1 = *pvVar4;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_128,
                              (long)cor_S2a_1._0_4_);
          thisS1b_corFactor_1 = *pvVar4;
          dVar1 = thisS2b_1;
          if ((file1._7_1_ & 1) != 0) {
            local_360 = thisS2b_1 * thisS1b_corFactor_1;
            thisS1a_1 = thisS2a_corFactor_1 * local_360 + thisS1a_1;
            dVar1 = local_360;
          }
          totalS2_1 = thisS1b_1 + totalS2_1;
          totalCorFactor_1 = dVar1 + totalCorFactor_1;
        }
        if ((file1._7_1_ & 1) != 0) {
          totalS2_1 = (thisS1a_1 / totalCorFactor_1) * totalS2_1;
        }
        local_418 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,totalS2_1);
        local_420 = std::operator<<(local_418,"\t");
        local_428 = (ostream *)std::ostream::operator<<(local_420,totalCorFactor_1);
        local_430 = std::operator<<(local_428,"\t");
        local_438 = (ostream *)std::ostream::operator<<(local_430,local_20);
        std::ostream::operator<<(local_438,std::endl<char,std::char_traits<char>>);
        size1_1._0_4_ = (int)size1_1 + 1;
        if ((halfLife._7_1_ & 1) != 0) {
          local_20 = -1;
        }
      }
      argv_local._4_4_ = 0;
      size1_1._4_4_ = 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_128);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               &S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               &S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               &S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 4) {
    cerr << "This program aims to take execNEST outputs, and combine energy "
            "deposits into Double Scatters. "
         << endl;
    cerr << endl
         << "Usage: " << endl
         << "./multipleScatter <nEvents> <nScatters> <Pulse Type> <File 1> "
            "<optional: File 2> "
         << endl;

    cerr << "  -- <nEvents> is the number of events to stitch together. "
         << endl;
    cerr << "  -- <nScatters> is the number of energy deposits to combine; use "
            "-1 for a random exponential draw. "
         << endl;
    cerr << "  -- <Pulse Type> is either 0 (for uncorrected pulses) or 1 (for "
            "corrected pulses); corrected pulses sum S2s and take an "
            "S2-weighted average S1c. "
         << endl;
    cerr << "  -- <File 1> is execNEST output events used to stitch together "
            "multiple scatters."
         << endl;
    cerr << "  -- <File 2> is optional, and will be the last scatter in each "
            "event, if provided."
         << endl;
    return 1;
  }
  // Load the number of events
  int nEvents = atoi(argv[1]);
  int nScatters = atoi(argv[2]);
  // RandomGen::rndm()->SetSeed(time(nullptr));
  bool randomScatters = false;
  if (nScatters < 2) {
    randomScatters = true;
  }
  // define parameters for random exponential draw of nScatters
  // if using nScatters = -1.
  // These are just 0th order fill-ins to produce a spread of values.
  double halfLife = 1.;
  double minScatters = 1.5;  // int-rounding will make the true minimum = 2
  double maxScatters = 50.;
  // Check if using corrected or uncorrected output pulse areas
  bool corrected = true;
  if (atoi(argv[3]) == 0) corrected = false;
  if (verbosity > 0) {
    if (corrected)
      cout << "S1c [phd]\tS2c [phd]\tnScatters" << endl;
    else
      cout << "S1 [phd]\tS2 [phd]\tnScatters" << endl;
  }
  bool sameFile = true;
  if (argc > 5) {
    sameFile = false;
    // cerr << "Using two files to generate scatters." << endl;
  }
  // open the first file and get the S1, S2, and their correction factors
  FILE *file1 = fopen(argv[4], "r");
  double a, b, c, d, e, f, g, h, i, j, k, l, m, n;
  int ch, nLines = 0;
  vector<double> S1a, S2a;
  vector<double> S1a_corFactor, S2a_corFactor;
  if (verbosity > 0) {
    while (EOF != (ch = getc(file1))) {
      if ('\n' == ch && nLines)
        break;
      else
        nLines = 0;
      if (']' == ch && nLines == 0) ++nLines;
    }
  }
  while (1) {
    int scan = fscanf(
        file1,
        "%lf\t%lf\t%lf\t%lf,%lf,%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf",
        &a, &b, &c, &d, &e, &f, &g, &h, &i, &j, &k, &l, &m, &n);
    if (feof(file1)) break;
    // fprintf(stderr,"%.6f\t%.6f\t%.6f\t%.6f,%.6f,%.6f\t%.6f\t%.6f\t%.6f\t%.6f\t%.6f\t%.6f\t%.6f\t%.6f\n",a,b,c,d,e,f,g,h,i,j,k,l,m,n);
    if ((fabs(n) > 1.) && (fabs(m) > 1.)) {
      S1a.push_back(fabs(j));
      S2a.push_back(fabs(m));
      S1a_corFactor.push_back(fabs(k / j));
      S2a_corFactor.push_back(fabs(n / m));
    }
  }  // Done with the first file....
  fclose(file1);
  if (!sameFile) {
    cerr << "Using two files to generate scatters..." << endl;
    // Load the 2nd file if provided, and stitch the two together to make
    // multiple scatter events scatters
    FILE *file2 = fopen(argv[5], "r");
    nLines = 0;
    double a2, b2, c2, d2, e2, f2, g2, h2, i2, j2, k2, l2, m2, n2;
    vector<double> S1b, S2b;
    vector<double> S1b_corFactor, S2b_corFactor;
    if (verbosity > 0) {
      while (EOF != (ch = getc(file2))) {
        if ('\n' == ch && nLines)
          break;
        else
          nLines = 0;
        if (']' == ch && nLines == 0) ++nLines;
      }
    }

    while (1) {
      int scan2 = fscanf(
          file2,
          "%lf\t%lf\t%lf\t%lf,%lf,%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf",
          &a2, &b2, &c2, &d2, &e2, &f2, &g2, &h2, &i2, &j2, &k2, &l2, &m2, &n2);
      if (feof(file2)) break;
      // fprintf(stderr,"%.6f\t%.6f\t%.6f\t%.6f,%.6f,%.6f\t%.6f\t%.6f\t%.6f\t%.6f\t%.6f\t%.6f\t%.6f\t%.6f\n",a,b,c,d,e,f,g,h,i,j,k,l,m,n);
      if ((fabs(n2) > 1.) &&
          (fabs(m2) > 1.)) {      // prevent loading events where S2 ~ PHE_MIN
        S1b.push_back(fabs(j2));  // was causing memory leaks
        S2b.push_back(fabs(m2));
        S1b_corFactor.push_back(fabs(k2 / j2));
        S2b_corFactor.push_back(fabs(n2 / m2));
      }
    }  // Done with the second file
    fclose(file2);

    auto size1 = S1a.size();
    auto size2 = S1b.size();
    double totalS1, totalS2, totalCorFactor;
    double thisS1a, thisS1b, thisS2a, thisS2b;
    double thisS1a_corFactor, thisS2a_corFactor, thisS1b_corFactor,
        thisS2b_corFactor;
    for (int ii = 0; ii < nEvents; ii++) {
      while (nScatters < 2) {
        nScatters =  // 0th order attempt at reproducing multiple scatter
                     // behavior
            (int)(RandomGen::rndm()->rand_exponential(halfLife, minScatters,
                                                      maxScatters) +
                  0.5);
      }
      totalS1 = 0.;
      totalCorFactor = 0.;
      totalS2 = 0.;
      for (int jj = 0; jj < nScatters - 1; jj++) {
        // randomly draw an energy deposit from the first file
        int index = RandomGen::rndm()->integer_range(0, (int)size1 - 1);

        thisS1a = S1a[index];
        thisS2a = S2a[index];
        thisS1a_corFactor = S1a_corFactor[index];
        thisS2a_corFactor = S2a_corFactor[index];
        if (corrected) {
          double cor_S2a = thisS2a * thisS2a_corFactor;
          totalS2 += cor_S2a;
          totalS1 += thisS1a;
          totalCorFactor += thisS1a_corFactor * cor_S2a;
        } else {
          totalS1 += thisS1a;
          totalS2 += thisS2a;
        }
      }  // now on to the last scatter from the 2nd file
      int index2 = RandomGen::rndm()->integer_range(0, (int)size2 - 1);
      thisS1b = S1b[index2];
      thisS2b = S2b[index2];
      thisS1b_corFactor = S1b_corFactor[index2];
      thisS2b_corFactor = S2b_corFactor[index2];

      if (corrected) {
        double cor_S2b = thisS2b * thisS2b_corFactor;
        totalS2 += cor_S2b;
        totalS1 += thisS1b;
        totalCorFactor += thisS1b_corFactor * cor_S2b;
        totalS1 *= totalCorFactor / totalS2;
      } else {
        totalS1 += thisS1b;
        totalS2 += thisS2b;
      }
      cout << totalS1 << "\t" << totalS2 << "\t" << nScatters
           << endl;  //"\t" << thisS1a << "  " << thisS1b << " " << thisS2a << "
                     //" << thisS2b << endl;
      if (randomScatters) nScatters = -1;
    }
    return 0;
  } else {
    cerr << "Generating multiple scatters from file..." << endl;
    // Drawing both scatters from the same file...
    int nGenerated = 0;

    auto size1 = S1a.size();
    double totalS1, totalS2, totalCorFactor;
    double thisS1a, thisS1b, thisS2a, thisS2b;
    double thisS1a_corFactor, thisS2a_corFactor, thisS1b_corFactor,
        thisS2b_corFactor;

    while (nGenerated < nEvents) {
      while (nScatters < 2) {
        nScatters =  // 0th order attempt at reproducing multiple scatter
                     // behavior
            (int)(RandomGen::rndm()->rand_exponential(halfLife, minScatters,
                                                      maxScatters) +
                  0.5);
      }
      totalS1 = 0.;
      totalCorFactor = 0.;
      totalS2 = 0.;
      for (int jj = 0; jj < nScatters; jj++) {
        // randomly draw an energy deposit from the first file
        int index = RandomGen::rndm()->integer_range(0, (int)size1 - 1);

        thisS1a = S1a[index];
        thisS2a = S2a[index];
        thisS1a_corFactor = S1a_corFactor[index];
        thisS2a_corFactor = S2a_corFactor[index];
        if (corrected) {
          double cor_S2a = thisS2a * thisS2a_corFactor;
          totalS2 += cor_S2a;
          totalS1 += thisS1a;
          totalCorFactor += thisS1a_corFactor * cor_S2a;
        } else {
          totalS1 += thisS1a;
          totalS2 += thisS2a;
        }
      }
      if (corrected)
        totalS1 *= totalCorFactor / totalS2;  // S2c-weighted average corrected
                                              // S1

      cout << totalS1 << "\t" << totalS2 << "\t" << nScatters
           << endl;  //"\t" << thisS1a << "  " << thisS1b << " " << thisS2a << "
                     //" << thisS2b << endl;
      nGenerated++;
      if (randomScatters) nScatters = -1;
    }
    return 0;
  }
}